

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::DecodeSortKeyArray
               (DecodeSortKeyData *decode_data,DecodeSortKeyVectorData *vector_data,Vector *result,
               idx_t result_idx)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  Vector *result_00;
  idx_t params_1;
  reference vector_data_00;
  idx_t iVar6;
  InvalidInputException *this_00;
  unsigned_long params;
  data_t dVar7;
  idx_t idx_in_entry;
  string local_58;
  idx_t local_38;
  
  dVar7 = decode_data->data[decode_data->position];
  decode_data->position = decode_data->position + 1;
  if (dVar7 == vector_data->null_byte) {
    FlatVector::VerifyFlatVector(result);
    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_38);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var3._M_p;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar2 = (byte)result_idx & 0x3f;
    puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
             (result_idx >> 6);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
  }
  params = 0;
  dVar7 = 0xff;
  if (vector_data->flip_bytes == false) {
    dVar7 = '\0';
  }
  result_00 = ArrayVector::GetEntry(result);
  params_1 = ArrayType::GetSize(&result->type);
  iVar6 = decode_data->position;
  if (dVar7 != decode_data->data[iVar6]) {
    if (params_1 == 0) {
      params = 1;
    }
    else {
      params = 1;
      do {
        vector_data_00 =
             vector<duckdb::DecodeSortKeyVectorData,_true>::operator[](&vector_data->child_data,0);
        DecodeSortKeyRecursive
                  (decode_data,vector_data_00,result_00,(result_idx * params_1 + params) - 1);
        iVar6 = decode_data->position;
        if (dVar7 == decode_data->data[iVar6]) break;
        params = params + 1;
      } while (params <= params_1);
    }
  }
  decode_data->position = iVar6 + 1;
  if (params != params_1) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Failed to decode array - found %d elements but expected %d","");
    InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
              (this_00,&local_58,params,params_1);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void DecodeSortKeyArray(DecodeSortKeyData &decode_data, DecodeSortKeyVectorData &vector_data, Vector &result,
                        idx_t result_idx) {
	// check if the top-level is valid or not
	auto validity_byte = decode_data.data[decode_data.position];
	decode_data.position++;
	if (validity_byte == vector_data.null_byte) {
		// entire array is NULL
		// note that we still read the child elements
		FlatVector::Validity(result).SetInvalid(result_idx);
	}
	// array is valid - decode child elements
	// arrays need to encode exactly array_size child elements
	// however the decoded data still contains a list delimiter
	// we use this delimiter to verify we successfully decoded the entire array
	auto list_delimiter = SortKeyVectorData::LIST_DELIMITER;
	if (vector_data.flip_bytes) {
		list_delimiter = ~list_delimiter;
	}
	auto &child_vector = ArrayVector::GetEntry(result);
	auto array_size = ArrayType::GetSize(result.GetType());

	idx_t found_elements = 0;
	auto child_start = array_size * result_idx;
	// loop until we find the list delimiter
	while (decode_data.data[decode_data.position] != list_delimiter) {
		found_elements++;
		if (found_elements > array_size) {
			// error - found too many elements
			break;
		}
		// now decode the entry
		DecodeSortKeyRecursive(decode_data, vector_data.child_data[0], child_vector, child_start + found_elements - 1);
	}
	// skip the list delimiter
	decode_data.position++;
	if (found_elements != array_size) {
		throw InvalidInputException("Failed to decode array - found %d elements but expected %d", found_elements,
		                            array_size);
	}
}